

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<unsigned_int,int,float>
               (ImGuiDataType data_type,uint *v,float v_speed,uint v_min,uint v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ImGuiDataType data_type_00;
  uint uVar13;
  int iVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 in_ZMM2 [64];
  undefined4 in_XMM4_Da;
  undefined1 in_register_00001304 [12];
  undefined1 local_78 [16];
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  pIVar8 = GImGui;
  uVar12 = data_type & 0xfffffffe;
  bVar15 = uVar12 != 8;
  bVar2 = v_max <= v_min;
  bVar3 = power == 1.0;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_min <= v_max && v_max - v_min != 0)) {
    auVar18 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,v_max - v_min);
    v_speed = auVar18._0_4_ * GImGui->DragSpeedDefaultRatio;
    in_XMM0_Db = 0;
    in_XMM0_Dc = 0;
    in_XMM0_Dd = 0;
  }
  uVar13 = flags & 1;
  local_78._4_4_ = in_XMM0_Db;
  local_78._0_4_ = v_speed;
  local_78._8_4_ = in_XMM0_Dc;
  local_78._12_4_ = in_XMM0_Dd;
  if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
      (bVar9 = IsMousePosValid((ImVec2 *)0x0), !bVar9)) ||
     ((pIVar8->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
    fVar16 = 0.0;
    if (pIVar8->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar10 = 0;
      if (uVar12 == 8) {
        uVar10 = ImParseFormatPrecision(format,3);
      }
      auVar20._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar20._8_56_ = extraout_var_00;
      local_50 = vmovlps_avx(auVar20._0_16_);
      fVar16 = *(float *)(local_48 + (ulong)uVar13 * 4 + -8);
      if ((int)uVar10 < 0) {
        auVar18 = SUB6416(ZEXT464(0x800000),0);
      }
      else if ((int)uVar10 < 10) {
        auVar18 = ZEXT416(*(uint *)(GetMinimumStepAtDecimalPrecision(int)::min_steps +
                                   (ulong)uVar10 * 4));
      }
      else {
        local_48 = ZEXT416((uint)fVar16);
        auVar21._0_4_ = powf(10.0,(float)(int)-uVar10);
        auVar21._4_60_ = extraout_var;
        auVar18 = auVar21._0_16_;
        fVar16 = (float)local_48._0_4_;
      }
      uVar4 = vcmpss_avx512f(auVar18,local_78,2);
      bVar9 = (bool)((byte)uVar4 & 1);
      v_speed = (float)((uint)bVar9 * (int)v_speed + (uint)!bVar9 * auVar18._0_4_);
    }
  }
  else {
    fVar16 = (pIVar8->IO).NavInputs[(ulong)uVar13 + 0x1d];
    bVar9 = (pIVar8->IO).KeyShift;
    bVar1 = (pIVar8->IO).KeyAlt;
    fVar16 = (float)((uint)(bVar1 & 1) * (int)(fVar16 * 0.01) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar16);
    fVar16 = (float)((uint)(bVar9 & 1) * (int)(fVar16 * 10.0) +
                    (uint)!(bool)(bVar9 & 1) * (int)fVar16);
  }
  uVar11 = (ulong)v_max;
  iVar14 = v_max - v_min;
  fVar16 = fVar16 * v_speed;
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  auVar18 = vxorps_avx512vl(ZEXT416((uint)fVar16),auVar18);
  fVar17 = (float)((uint)(uVar13 == 0) * (int)fVar16 + (uint)(uVar13 != 0) * auVar18._0_4_);
  if (v_max < v_min || iVar14 == 0) {
    bVar9 = false;
  }
  else {
    uVar13 = *v;
    if ((uVar13 < v_max) || (bVar9 = true, fVar17 <= 0.0)) {
      uVar11 = (ulong)CONCAT31((int3)(v_max >> 8),uVar13 <= v_min);
      bVar9 = fVar17 < 0.0 && uVar13 <= v_min;
    }
  }
  if ((bVar2 || bVar15) || bVar3) {
LAB_0026676d:
    bVar1 = false;
  }
  else if ((0.0 <= fVar17) || (bVar1 = true, pIVar8->DragCurrentAccum <= 0.0)) {
    if (fVar17 <= 0.0) goto LAB_0026676d;
    bVar1 = pIVar8->DragCurrentAccum < 0.0;
  }
  uVar13 = (uint)CONCAT71((int7)(uVar11 >> 8),pIVar8->ActiveIdIsJustActivated | bVar9);
  if (((pIVar8->ActiveIdIsJustActivated & 1U) != 0 || bVar9 != false) || (bVar1)) {
    pIVar8->DragCurrentAccum = 0.0;
    bVar9 = false;
  }
  else {
    if ((fVar16 == 0.0) && (!NAN(fVar16))) goto LAB_002667ac;
    pIVar8->DragCurrentAccum = fVar17 + pIVar8->DragCurrentAccum;
    bVar9 = true;
  }
  pIVar8->DragCurrentAccumDirty = bVar9;
LAB_002667ac:
  if (pIVar8->DragCurrentAccumDirty != true) {
    return false;
  }
  if ((bVar2 || bVar15) || bVar3) {
    data_type_00 = *v + (int)pIVar8->DragCurrentAccum;
    fVar16 = 0.0;
  }
  else {
    auVar22._4_12_ = in_register_00001304;
    auVar22._0_4_ = in_XMM4_Da;
    auVar18 = vcvtusi2ss_avx512f(auVar22,*v - v_min);
    auVar5._4_12_ = in_register_00001304;
    auVar5._0_4_ = in_XMM4_Da;
    auVar22 = vcvtusi2ss_avx512f(auVar5,iVar14);
    fVar16 = powf(auVar18._0_4_ / auVar22._0_4_,1.0 / power);
    auVar22 = ZEXT416((uint)(fVar16 + pIVar8->DragCurrentAccum / auVar22._0_4_));
    auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar22);
    uVar4 = vcmpss_avx512f(auVar22,ZEXT816(0) << 0x40,1);
    fVar19 = powf((float)((uint)!(bool)((byte)uVar4 & 1) * auVar18._0_4_),power);
    data_type_00 = (int)fVar19 * iVar14 + v_min;
  }
  uVar13 = RoundScalarWithFormatT<unsigned_int,int>
                     ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,uVar13);
  pIVar8->DragCurrentAccumDirty = false;
  if ((bVar2 || bVar15) || bVar3) {
    fVar19 = (float)(int)(uVar13 - *v);
  }
  else {
    auVar6._4_12_ = in_register_00001304;
    auVar6._0_4_ = in_XMM4_Da;
    auVar18 = vcvtusi2ss_avx512f(auVar6,uVar13 - v_min);
    auVar7._4_12_ = in_register_00001304;
    auVar7._0_4_ = in_XMM4_Da;
    auVar22 = vcvtusi2ss_avx512f(auVar7,iVar14);
    fVar19 = powf(auVar18._0_4_ / auVar22._0_4_,1.0 / power);
    fVar19 = fVar19 - fVar16;
  }
  pIVar8->DragCurrentAccum = pIVar8->DragCurrentAccum - fVar19;
  uVar10 = *v;
  if ((v_min < v_max) && (uVar10 != uVar13)) {
    if ((uVar13 < v_min) || (((uVar12 != 8 && (uVar10 < uVar13)) && (fVar17 < 0.0)))) {
      uVar13 = v_min;
    }
    if ((v_max < uVar13) || (((uVar12 != 8 && (uVar13 < uVar10)) && (0.0 < fVar17)))) {
      uVar13 = v_max;
    }
  }
  if (uVar10 != uVar13) {
    *v = uVar13;
    return true;
  }
  return uVar10 != uVar13;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}